

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_setint(lua_State *L,Table *t,lua_Integer key,TValue *value)

{
  TValue *io2;
  TValue *io1;
  TValue *io;
  TValue k;
  TValue *p;
  TValue *value_local;
  lua_Integer key_local;
  Table *t_local;
  lua_State *L_local;
  
  k._8_8_ = luaH_getint(t,key);
  if (((TValue *)k._8_8_)->tt_ == ' ') {
    k.value_.ub = '\x03';
    io = (TValue *)key;
    luaH_newkey(L,t,(TValue *)&io,value);
  }
  else {
    ((TValue *)k._8_8_)->value_ = value->value_;
    ((TValue *)k._8_8_)->tt_ = value->tt_;
  }
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, lua_Integer key, TValue *value) {
  const TValue *p = luaH_getint(t, key);
  if (isabstkey(p)) {
    TValue k;
    setivalue(&k, key);
    luaH_newkey(L, t, &k, value);
  }
  else
    setobj2t(L, cast(TValue *, p), value);
}